

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O0

void aom_img_truncate_16_to_8(aom_image_t *dst,aom_image_t *src)

{
  int iVar1;
  int *in_RSI;
  int *in_RDI;
  uint8_t *p_dst;
  uint16_t *p_src;
  int y;
  int x;
  int h;
  int w;
  int plane;
  undefined1 *local_38;
  undefined2 *local_30;
  int local_24;
  int local_20;
  uint local_1c;
  uint local_18;
  int local_14;
  
  if ((((*in_RDI + 0x800 == *in_RSI) && (in_RDI[10] == in_RSI[10])) && (in_RDI[0xb] == in_RSI[0xb]))
     && ((in_RDI[0xe] == in_RSI[0xe] && (in_RDI[0xf] == in_RSI[0xf])))) {
    iVar1 = *in_RDI;
    if ((iVar1 != 0x102) && (iVar1 != 0x105 && iVar1 != 0x106)) {
      fatal("Unsupported image conversion");
    }
    for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
      local_18 = in_RSI[10];
      local_1c = in_RSI[0xb];
      if (local_14 != 0) {
        local_18 = local_18 + in_RSI[0xe] >> ((byte)in_RSI[0xe] & 0x1f);
        local_1c = local_1c + in_RSI[0xf] >> ((byte)in_RSI[0xf] & 0x1f);
      }
      for (local_24 = 0; local_24 < (int)local_1c; local_24 = local_24 + 1) {
        local_38 = (undefined1 *)
                   (*(long *)(in_RDI + (long)local_14 * 2 + 0x10) +
                   (long)(local_24 * in_RDI[(long)local_14 + 0x16]));
        local_30 = (undefined2 *)
                   (*(long *)(in_RSI + (long)local_14 * 2 + 0x10) +
                   (long)(local_24 * in_RSI[(long)local_14 + 0x16]));
        for (local_20 = 0; local_20 < (int)local_18; local_20 = local_20 + 1) {
          *local_38 = (char)*local_30;
          local_38 = local_38 + 1;
          local_30 = local_30 + 1;
        }
      }
    }
    return;
  }
  fatal("Unsupported image conversion");
}

Assistant:

void aom_img_truncate_16_to_8(aom_image_t *dst, const aom_image_t *src) {
  int plane;
  if (dst->fmt + AOM_IMG_FMT_HIGHBITDEPTH != src->fmt || dst->d_w != src->d_w ||
      dst->d_h != src->d_h || dst->x_chroma_shift != src->x_chroma_shift ||
      dst->y_chroma_shift != src->y_chroma_shift) {
    fatal("Unsupported image conversion");
  }
  switch (dst->fmt) {
    case AOM_IMG_FMT_I420:
    case AOM_IMG_FMT_I422:
    case AOM_IMG_FMT_I444: break;
    default: fatal("Unsupported image conversion");
  }
  for (plane = 0; plane < 3; plane++) {
    int w = src->d_w;
    int h = src->d_h;
    int x, y;
    if (plane) {
      w = (w + src->x_chroma_shift) >> src->x_chroma_shift;
      h = (h + src->y_chroma_shift) >> src->y_chroma_shift;
    }
    for (y = 0; y < h; y++) {
      const uint16_t *p_src =
          (const uint16_t *)(src->planes[plane] + y * src->stride[plane]);
      uint8_t *p_dst = dst->planes[plane] + y * dst->stride[plane];
      for (x = 0; x < w; x++) {
        *p_dst++ = (uint8_t)(*p_src++);
      }
    }
  }
}